

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O0

int __thiscall
dit::anon_unknown_0::CaseListParserTests::init(CaseListParserTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  CaseListParserTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  TrieParserTests::TrieParserTests
            ((TrieParserTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  ListParserTests::ListParserTests
            ((ListParserTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new TrieParserTests(m_testCtx));
		addChild(new ListParserTests(m_testCtx));
	}